

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_rand.c
# Opt level: O2

ares_bool_t ares_init_rand_engine(ares_rand_state *state)

{
  anon_union_272_2_42d3ba2e_for_state *addr;
  char cVar1;
  byte bVar2;
  ares_bool_t aVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  FILE *__stream;
  long lVar7;
  uchar swapByte;
  ulong local_60;
  uint local_58;
  uint local_54;
  uint local_50;
  ares_timeval_t local_38;
  
  state->cache_remaining = 0;
  aVar3 = state->bad_backends;
  if ((aVar3 & ARES_TRUE) == ARES_FALSE) {
    state->type = ARES_RAND_OS;
  }
  else {
    if ((aVar3 & 2) == ARES_FALSE) {
      state->type = ARES_RAND_FILE;
      __stream = fopen("/dev/urandom","rb");
      (state->state).rand_file = (FILE *)__stream;
      if (__stream != (FILE *)0x0) {
        aVar3 = setvbuf(__stream,(char *)0x0,2,0);
        return aVar3;
      }
    }
    state->type = ARES_RAND_RC4;
    addr = &state->state;
    local_58 = ares_u32_from_ptr(addr);
    local_54 = ares_u32_from_ptr(&local_60);
    ares_tvnow(&local_38);
    local_50 = local_38.usec | (uint)local_38.sec;
    uVar4 = ares_u32_from_ptr(addr);
    uVar5 = ares_u32_from_ptr(&local_60);
    srand(uVar4 | uVar5 | (uint)local_38.sec | local_38.usec);
    for (local_60 = 0xc; local_60 < 0x20; local_60 = local_60 + 1) {
      iVar6 = rand();
      *(char *)((long)&local_58 + local_60) = (char)iVar6;
    }
    for (lVar7 = 0; lVar7 != 0x100; lVar7 = lVar7 + 1) {
      *(char *)((long)addr + lVar7) = (char)lVar7;
    }
    aVar3 = ARES_FALSE;
    for (lVar7 = 0; lVar7 != 0x100; lVar7 = lVar7 + 1) {
      cVar1 = *(char *)((long)addr + lVar7);
      bVar2 = (char)aVar3 + cVar1 + *(char *)((long)&local_58 + (ulong)((uint)lVar7 & 0x1f));
      aVar3 = (ares_bool_t)bVar2;
      *(undefined1 *)((long)addr + lVar7) = *(undefined1 *)((long)addr + (ulong)bVar2);
      *(char *)((long)addr + (ulong)bVar2) = cVar1;
    }
    (state->state).rc4.i = 0;
    (state->state).rc4.j = 0;
  }
  return aVar3;
}

Assistant:

static ares_bool_t ares_init_rand_engine(ares_rand_state *state)
{
  state->cache_remaining = 0;

#ifdef FUZZING_BUILD_MODE_UNSAFE_FOR_PRODUCTION
  /* For fuzzing, random should be deterministic */
  state->bad_backends |= ARES_RAND_OS | ARES_RAND_FILE;
#endif

#if defined(HAVE_ARC4RANDOM_BUF) || defined(HAVE_GETRANDOM) || defined(_WIN32)
  if (!(state->bad_backends & ARES_RAND_OS)) {
    state->type = ARES_RAND_OS;
    return ARES_TRUE;
  }
#endif

#if defined(CARES_RANDOM_FILE)
  /* LCOV_EXCL_START: FallbackCode */
  if (!(state->bad_backends & ARES_RAND_FILE)) {
    state->type            = ARES_RAND_FILE;
    state->state.rand_file = fopen(CARES_RANDOM_FILE, "rb");
    if (state->state.rand_file) {
      setvbuf(state->state.rand_file, NULL, _IONBF, 0);
      return ARES_TRUE;
    }
  }
  /* LCOV_EXCL_STOP */

  /* Fall-Thru on failure to RC4 */
#endif

  /* LCOV_EXCL_START: FallbackCode */
  state->type = ARES_RAND_RC4;
  ares_rc4_init(&state->state.rc4);
  /* LCOV_EXCL_STOP */

  /* Currently cannot fail */
  return ARES_TRUE; /* LCOV_EXCL_LINE: UntestablePath */
}